

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

void CInit(N_Vector c,WebData wdata)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long in_RSI;
  undefined8 in_RDI;
  double dVar6;
  double dVar7;
  sunrealtype *cdata;
  sunrealtype y_factor;
  sunrealtype x_factor;
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype y;
  sunrealtype x;
  sunrealtype argy;
  sunrealtype argx;
  int mxns;
  int ns;
  int jy;
  int jx;
  int iyoff;
  int ioff;
  int ici;
  int i;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_14;
  
  lVar5 = N_VGetArrayPointer(in_RDI);
  iVar3 = *(int *)(in_RSI + 0x40);
  iVar4 = *(int *)(in_RSI + 0x44);
  dVar1 = *(double *)(in_RSI + 0x310);
  dVar2 = *(double *)(in_RSI + 0x318);
  for (local_28 = 0; local_28 < 0x14; local_28 = local_28 + 1) {
    dVar6 = (double)local_28 * dVar2;
    for (local_24 = 0; local_24 < 0x14; local_24 = local_24 + 1) {
      dVar7 = (double)local_24 * dVar1;
      for (local_14 = 1; local_14 <= iVar3; local_14 = local_14 + 1) {
        *(double *)(lVar5 + (long)(iVar4 * local_28 + iVar3 * local_24 + local_14 + -1) * 8) =
             (double)local_14 * dVar7 * 4.0 * (1.0 - dVar7) * dVar7 * 4.0 * (1.0 - dVar7) *
             dVar6 * 4.0 * (1.0 - dVar6) * dVar6 * 4.0 * (1.0 - dVar6) + 10.0;
      }
    }
  }
  *(undefined8 *)(lVar5 + 0x4b00) = 0;
  return;
}

Assistant:

static void CInit(N_Vector c, WebData wdata)
{
  int i, ici, ioff, iyoff, jx, jy, ns, mxns;
  sunrealtype argx, argy, x, y, dx, dy, x_factor, y_factor, *cdata;

  cdata = N_VGetArrayPointer(c);
  ns    = wdata->ns;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  x_factor = SUN_RCONST(4.0) / SQR(AX);
  y_factor = SUN_RCONST(4.0) / SQR(AY);
  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    argy  = SQR(y_factor * y * (AY - y));
    iyoff = mxns * jy;
    for (jx = 0; jx < MX; jx++)
    {
      x    = jx * dx;
      argx = SQR(x_factor * x * (AX - x));
      ioff = iyoff + ns * jx;
      for (i = 1; i <= ns; i++)
      {
        ici        = ioff + i - 1;
        cdata[ici] = SUN_RCONST(10.0) + i * argx * argy;

        /*if(i==1) cdata[ici] += ONE;*/
      }
    }
  }

  /* Initialize quadrature variable to zero */
  cdata[NEQ] = ZERO;
}